

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_unlink_ex(LIBSSH2_SFTP *sftp,char *filename,uint filename_len)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  time_t start_time;
  ulong uVar5;
  char *errmsg;
  ulong buflen;
  uchar *s;
  size_t data_len;
  uchar *local_68;
  uchar *local_60;
  size_t local_58;
  time_t local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    return -0x27;
  }
  local_38 = filename;
  start_time = time((time_t *)0x0);
  local_48 = (ulong)filename_len;
  buflen = (ulong)(filename_len + 0xd);
  local_40 = (ulong)(filename_len + 9);
  local_50 = start_time;
  do {
    channel = sftp->channel;
    pLVar1 = channel->session;
    local_58 = 0;
    local_68 = (uchar *)0x0;
    if (sftp->unlink_state == libssh2_NB_state_idle) {
      sftp->last_errno = 0;
      local_60 = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
      sftp->unlink_packet = local_60;
      if (local_60 != (uchar *)0x0) {
        _libssh2_store_u32(&local_60,(uint32_t)local_40);
        *local_60 = '\r';
        uVar4 = sftp->request_id;
        sftp->request_id = uVar4 + 1;
        sftp->unlink_request_id = uVar4;
        local_60 = local_60 + 1;
        _libssh2_store_u32(&local_60,uVar4);
        start_time = local_50;
        _libssh2_store_str(&local_60,local_38,local_48);
        sftp->unlink_state = libssh2_NB_state_created;
        goto LAB_00126d93;
      }
      iVar3 = -6;
      errmsg = "Unable to allocate memory for FXP_REMOVE packet";
      local_60 = (uchar *)0x0;
      goto LAB_00126eef;
    }
LAB_00126d93:
    if (sftp->unlink_state == libssh2_NB_state_created) {
      bVar2 = false;
      uVar5 = _libssh2_channel_write(channel,0,sftp->unlink_packet,buflen);
      if (uVar5 == 0xffffffffffffffdb) {
        iVar3 = -0x25;
      }
      else {
        iVar3 = (*pLVar1->free)(sftp->unlink_packet,&pLVar1->abstract);
        sftp->unlink_packet = (uchar *)0x0;
        if (uVar5 == buflen) {
          sftp->unlink_state = libssh2_NB_state_sent;
          bVar2 = true;
        }
        else {
          sftp->unlink_state = libssh2_NB_state_idle;
          iVar3 = _libssh2_error(pLVar1,-7,"Unable to send FXP_REMOVE command");
          bVar2 = false;
        }
      }
      if (bVar2) goto LAB_00126e40;
    }
    else {
LAB_00126e40:
      iVar3 = sftp_packet_require(sftp,'e',sftp->unlink_request_id,&local_68,&local_58,9);
      if (iVar3 == 0) {
        sftp->unlink_state = libssh2_NB_state_idle;
        uVar4 = _libssh2_ntohu32(local_68 + 5);
        (*pLVar1->free)(local_68,&pLVar1->abstract);
        if (uVar4 != 0) {
          sftp->last_errno = uVar4;
          iVar3 = -0x1f;
          errmsg = "SFTP Protocol Error";
          goto LAB_00126eef;
        }
        iVar3 = 0;
      }
      else if (iVar3 != -0x25) {
        if (iVar3 == -0x26) {
          if (local_58 != 0) {
            (*pLVar1->free)(local_68,&pLVar1->abstract);
          }
          iVar3 = -0x1f;
          errmsg = "SFTP unlink packet too short";
        }
        else {
          sftp->unlink_state = libssh2_NB_state_idle;
          errmsg = "Error waiting for FXP STATUS";
        }
LAB_00126eef:
        iVar3 = _libssh2_error(pLVar1,iVar3,errmsg);
      }
    }
    if (iVar3 != -0x25) {
      return iVar3;
    }
    pLVar1 = sftp->channel->session;
    if (pLVar1 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar1->api_block_mode == 0) {
      return -0x25;
    }
    iVar3 = _libssh2_wait_socket(pLVar1,start_time);
    if (iVar3 != 0) {
      return iVar3;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_sftp_unlink_ex(LIBSSH2_SFTP *sftp, const char *filename,
                       unsigned int filename_len)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_unlink(sftp, filename, filename_len));
    return rc;
}